

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::createSchemaElementDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,bool *isDuplicate,XMLCh **valConstraint
          ,bool topLevel)

{
  short sVar1;
  short sVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  short *psVar6;
  undefined4 extraout_var_00;
  SchemaElementDecl *this_00;
  short *psVar7;
  long lVar8;
  uint enclosingScope;
  undefined7 in_register_00000089;
  uint uriId;
  long *plVar5;
  
  if ((int)CONCAT71(in_register_00000089,topLevel) != 0) {
    uriId = this->fTargetNSURI;
    enclosingScope = 0xfffffffe;
    goto LAB_0032da7d;
  }
  uriId = this->fEmptyNamespaceURI;
  enclosingScope = this->fCurrentScope;
  iVar4 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_FORM);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if ((plVar5 == (long *)0x0) ||
     (psVar6 = (short *)(**(code **)(*plVar5 + 0x150))(plVar5), psVar6 == (short *)0x0)) {
    if ((this->fSchemaInfo->fElemAttrDefaultQualified & 1) != 0) goto LAB_0032da4f;
    psVar7 = &SchemaSymbols::fgATTVAL_QUALIFIED;
LAB_0032da0d:
    sVar1 = *psVar7;
joined_r0x0032d9f5:
    if (sVar1 == 0) goto LAB_0032da4f;
  }
  else {
    sVar1 = *psVar6;
    if (sVar1 == 0) {
      if ((psVar6 != &SchemaSymbols::fgATTVAL_QUALIFIED) &&
         ((this->fSchemaInfo->fElemAttrDefaultQualified & 1) == 0)) {
        psVar7 = &SchemaSymbols::fgATTVAL_QUALIFIED;
        do {
          sVar1 = *psVar6;
          if (sVar1 == 0) goto LAB_0032da0d;
          psVar6 = psVar6 + 1;
          sVar2 = *psVar7;
          psVar7 = psVar7 + 1;
        } while (sVar1 == sVar2);
        goto LAB_0032da53;
      }
    }
    else if (psVar6 != &SchemaSymbols::fgATTVAL_QUALIFIED) {
      lVar3 = 0;
      do {
        lVar8 = lVar3;
        if (sVar1 != *(short *)((long)&SchemaSymbols::fgATTVAL_QUALIFIED + lVar8))
        goto LAB_0032da53;
        sVar1 = *(short *)((long)psVar6 + lVar8 + 2);
        lVar3 = lVar8 + 2;
      } while (sVar1 != 0);
      sVar1 = *(short *)((long)&DAT_00368802 + lVar8);
      goto joined_r0x0032d9f5;
    }
LAB_0032da4f:
    uriId = this->fTargetNSURI;
  }
LAB_0032da53:
  iVar4 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                    (this->fSchemaGrammar,(ulong)uriId,name,0,(ulong)enclosingScope);
  if ((SchemaElementDecl *)CONCAT44(extraout_var_00,iVar4) != (SchemaElementDecl *)0x0) {
    *isDuplicate = true;
    return (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar4);
  }
LAB_0032da7d:
  this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fGrammarPoolMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (this_00,L"",name,uriId,Any,enclosingScope,this->fGrammarPoolMemoryManager);
  (this_00->super_XMLElementDecl).fCreateReason = Declared;
  if (topLevel) {
    this_00->fPSVIScope = SCP_GLOBAL;
  }
  processElemDeclAttrs(this,elem,this_00,valConstraint,topLevel);
  return this_00;
}

Assistant:

SchemaElementDecl*
TraverseSchema::createSchemaElementDecl(const DOMElement* const elem,
                                        const XMLCh* const name,
                                        bool& isDuplicate,
                                        const XMLCh*& valConstraint,
                                        const bool topLevel)
{
    unsigned int enclosingScope = fCurrentScope;
    int uriIndex = fEmptyNamespaceURI;

    if (topLevel) {

        uriIndex = fTargetNSURI;
        enclosingScope = Grammar::TOP_LEVEL_SCOPE;
    }
    else
    {
        const XMLCh* elemForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);

        if (((!elemForm || !*elemForm) &&
            (fSchemaInfo->getElemAttrDefaultQualified() & Elem_Def_Qualified))
            || XMLString::equals(elemForm,SchemaSymbols::fgATTVAL_QUALIFIED))
            uriIndex = fTargetNSURI;

        // Check for duplicate elements
        SchemaElementDecl* other = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(uriIndex, name, 0, enclosingScope);

        if (other != 0)
        {
            isDuplicate = true;
            return other;
        }
    }

    // create element decl and add it to the grammar
    Janitor<SchemaElementDecl>    elemDecl(new (fGrammarPoolMemoryManager) SchemaElementDecl(
        XMLUni::fgZeroLenString , name, uriIndex , SchemaElementDecl::Any
        , enclosingScope , fGrammarPoolMemoryManager
    ));

    elemDecl->setCreateReason(XMLElementDecl::Declared);

    if (topLevel)
        elemDecl->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    // process attributes
    processElemDeclAttrs(elem, elemDecl.get(), valConstraint, topLevel);

    return elemDecl.release();
}